

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_manager.cpp
# Opt level: O0

TemporaryMemoryManager * __thiscall
duckdb::BufferManager::GetTemporaryMemoryManager(BufferManager *this)

{
  NotImplementedException *this_00;
  string *in_stack_ffffffffffffffa8;
  allocator local_29;
  string local_28 [40];
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_28,"This type of BufferManager does not have a TemporaryMemoryManager",&local_29)
  ;
  NotImplementedException::NotImplementedException(this_00,in_stack_ffffffffffffffa8);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,
              NotImplementedException::~NotImplementedException);
}

Assistant:

TemporaryMemoryManager &BufferManager::GetTemporaryMemoryManager() {
	throw NotImplementedException("This type of BufferManager does not have a TemporaryMemoryManager");
}